

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O0

Variable __thiscall
LiteScript::Callback::operator()
          (Callback *this,State *state,
          vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *args)

{
  undefined8 this_00;
  vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *pvVar1;
  Variable *v;
  Namer *n;
  pointer in_RCX;
  uint *extraout_RDX;
  Variable VVar3;
  Instruction local_b8;
  undefined1 local_a8 [32];
  undefined1 local_88 [24];
  undefined1 local_70 [24];
  Namer *namer;
  undefined1 local_38 [24];
  vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *args_local;
  State *state_local;
  Callback *this_local;
  Variable *result;
  uint *puVar2;
  
  local_38._16_8_ = in_RCX;
  args_local = args;
  state_local = state;
  this_local = this;
  Instruction::Instruction((Instruction *)&stack0xffffffffffffffb8,INSTR_PUSH_NSP);
  State::ExecuteSingle((State *)local_38,(Instruction *)args);
  Variable::~Variable((Variable *)local_38);
  Instruction::~Instruction((Instruction *)&stack0xffffffffffffffb8);
  pvVar1 = args_local;
  if (((ulong)(((state->args_tmp).
                super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->
              super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>).
              _M_impl.super__Vector_impl_data._M_start & 1) == 0) {
    v = Nullable<LiteScript::Variable>::operator*
                  ((Nullable<LiteScript::Variable> *)&state->nsp_global);
    State::SetThis((State *)pvVar1,v);
  }
  if ((state->instr).
      super__Vector_base<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>,_std::allocator<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
    local_70._16_8_ = State::GetNamer((State *)args_local);
    n = Nullable<LiteScript::Namer>::operator*
                  ((Nullable<LiteScript::Namer> *)
                   &(state->args_tmp).
                    super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Namer::operator=((Namer *)local_70._16_8_,n);
    this_00 = local_70._16_8_;
    Memory::Create((Memory *)local_70,
                   (Type *)args_local[9].
                           super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                           ._M_impl.super__Vector_impl_data._M_start);
    Namer::Push((Namer *)this_00,(Variable *)local_70);
    Variable::~Variable((Variable *)local_70);
    State::AddCallback((State *)args_local,
                       *(uint *)&(state->instr).
                                 super__Vector_base<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>,_std::allocator<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                       *(uint *)((long)&(state->instr).
                                        super__Vector_base<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>,_std::allocator<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 4));
    State::DefineArgs((State *)args_local,
                      (vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)
                      local_38._16_8_);
    VVar3 = Memory::Create((Memory *)this,
                           (Type *)args_local[9].
                                   super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
    puVar2 = VVar3.nb_ref;
  }
  else {
    local_88[0x17] = 0;
    (*(code *)(state->instr).
              super__Vector_base<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>,_std::allocator<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)(this,args_local,local_38._16_8_);
    pvVar1 = args_local;
    Instruction::Instruction((Instruction *)(local_a8 + 0x10),INSTR_POP_NSP);
    State::ExecuteSingle((State *)local_88,(Instruction *)pvVar1);
    Variable::~Variable((Variable *)local_88);
    Instruction::~Instruction((Instruction *)(local_a8 + 0x10));
    pvVar1 = args_local;
    Instruction::Instruction(&local_b8,INSTR_VALUE_POP);
    State::ExecuteSingle((State *)local_a8,(Instruction *)pvVar1);
    Variable::~Variable((Variable *)local_a8);
    Instruction::~Instruction(&local_b8);
    puVar2 = extraout_RDX;
  }
  VVar3.nb_ref = puVar2;
  VVar3.obj = (Object *)this;
  return VVar3;
}

Assistant:

LiteScript::Variable LiteScript::Callback::operator()(State& state, std::vector<Variable> &args) {
    state.ExecuteSingle(Instruction(InstrCode::INSTR_PUSH_NSP));
    if (!this->This.isNull)
        state.SetThis(*this->This);
    if (this->call_ptr == nullptr) {
        Namer& namer = state.GetNamer();
        namer = *this->nsp;
        namer.Push(state.memory.Create(Type::NAMESPACE));
        state.AddCallback(this->intrl_idx, this->line_num);
        state.DefineArgs(args);
        return state.memory.Create(Type::UNDEFINED);
    }
    else {
        Variable result = this->call_ptr(state, args);
        state.ExecuteSingle(Instruction(InstrCode::INSTR_POP_NSP));
        state.ExecuteSingle(Instruction(InstrCode::INSTR_VALUE_POP));
        return result;
    }
}